

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rbuIndexCntFunc(sqlite3_context *pCtx,int nVal,sqlite3_value **apVal)

{
  void *pvVar1;
  sqlite3 *db;
  sqlite3_stmt *pStmt_00;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  Mem *pMVar5;
  i64 iVar6;
  char *zErrmsg;
  sqlite3_stmt *pStmt;
  char *local_38;
  sqlite3_stmt *local_30;
  
  pvVar1 = pCtx->pFunc->pUserData;
  local_30 = (sqlite3_stmt *)0x0;
  local_38 = (char *)0x0;
  db = *(sqlite3 **)((long)pvVar1 + 8);
  pvVar3 = sqlite3ValueText(*apVal,'\x01');
  pcVar4 = sqlite3_mprintf("SELECT count(*) FROM sqlite_master WHERE type=\'index\' AND tbl_name = %Q"
                           ,pvVar3);
  iVar2 = prepareFreeAndCollectError(db,&local_30,&local_38,pcVar4);
  pStmt_00 = local_30;
  if (iVar2 == 0) {
    iVar2 = sqlite3_step(local_30);
    if (iVar2 == 100) {
      pMVar5 = columnMem(pStmt_00,0);
      iVar6 = sqlite3VdbeIntValue(pMVar5);
      columnMallocFailure(pStmt_00);
      iVar6 = (i64)(int)iVar6;
    }
    else {
      iVar6 = 0;
    }
    iVar2 = sqlite3_finalize(pStmt_00);
    if (iVar2 == 0) {
      pMVar5 = pCtx->pOut;
      if ((pMVar5->flags & 0x2400) == 0) {
        (pMVar5->u).i = iVar6;
        pMVar5->flags = 4;
      }
      else {
        vdbeReleaseAndSetInt64(pMVar5,iVar6);
      }
      goto LAB_001d2abb;
    }
    pcVar4 = sqlite3_errmsg(*(sqlite3 **)((long)pvVar1 + 8));
    pCtx->isError = 1;
    pMVar5 = pCtx->pOut;
  }
  else {
    pCtx->isError = 1;
    pMVar5 = pCtx->pOut;
    pcVar4 = local_38;
  }
  sqlite3VdbeMemSetStr(pMVar5,pcVar4,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
LAB_001d2abb:
  sqlite3_free(local_38);
  return;
}

Assistant:

static void rbuIndexCntFunc(
  sqlite3_context *pCtx, 
  int nVal,
  sqlite3_value **apVal
){
  sqlite3rbu *p = (sqlite3rbu*)sqlite3_user_data(pCtx);
  sqlite3_stmt *pStmt = 0;
  char *zErrmsg = 0;
  int rc;

  assert( nVal==1 );
  
  rc = prepareFreeAndCollectError(p->dbMain, &pStmt, &zErrmsg, 
      sqlite3_mprintf("SELECT count(*) FROM sqlite_master "
        "WHERE type='index' AND tbl_name = %Q", sqlite3_value_text(apVal[0]))
  );
  if( rc!=SQLITE_OK ){
    sqlite3_result_error(pCtx, zErrmsg, -1);
  }else{
    int nIndex = 0;
    if( SQLITE_ROW==sqlite3_step(pStmt) ){
      nIndex = sqlite3_column_int(pStmt, 0);
    }
    rc = sqlite3_finalize(pStmt);
    if( rc==SQLITE_OK ){
      sqlite3_result_int(pCtx, nIndex);
    }else{
      sqlite3_result_error(pCtx, sqlite3_errmsg(p->dbMain), -1);
    }
  }

  sqlite3_free(zErrmsg);
}